

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O1

void __thiscall
RegVmLoweredBlock::AddInstruction
          (RegVmLoweredBlock *this,ExpressionContext *ctx,SynBase *location,
          RegVmInstructionCode code,uchar rA,uchar rB,uchar rC)

{
  Allocator *pAVar1;
  int iVar2;
  undefined4 extraout_var;
  RegVmLoweredInstruction *instruction;
  
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x70);
  instruction = (RegVmLoweredInstruction *)CONCAT44(extraout_var,iVar2);
  pAVar1 = ctx->allocator;
  instruction->location = location;
  instruction->code = code;
  instruction->rA = rA;
  instruction->rB = rB;
  instruction->rC = rC;
  instruction->argument = (VmConstant *)0x0;
  (instruction->preKillRegisters).allocator = pAVar1;
  (instruction->preKillRegisters).data = (instruction->preKillRegisters).little;
  (instruction->preKillRegisters).count = 0;
  (instruction->preKillRegisters).max = 8;
  (instruction->postKillRegisters).allocator = pAVar1;
  (instruction->postKillRegisters).data = (instruction->postKillRegisters).little;
  (instruction->postKillRegisters).count = 0;
  (instruction->postKillRegisters).max = 8;
  instruction->nextSibling = (RegVmLoweredInstruction *)0x0;
  instruction->parent = (RegVmLoweredBlock *)0x0;
  instruction->prevSibling = (RegVmLoweredInstruction *)0x0;
  AddInstruction(this,(ExpressionContext *)0x800000000,instruction);
  return;
}

Assistant:

void RegVmLoweredBlock::AddInstruction(ExpressionContext &ctx, SynBase *location, RegVmInstructionCode code, unsigned char rA, unsigned char rB, unsigned char rC)
{
	AddInstruction(ctx, new (ctx.get<RegVmLoweredInstruction>()) RegVmLoweredInstruction(ctx.allocator, location, code, rA, rB, rC, NULL));
}